

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O3

QJsonValue * __thiscall QCborValue::toJsonValue(QJsonValue *__return_storage_ptr__,QCborValue *this)

{
  Type t;
  long idx;
  QJsonValue *result;
  bool b;
  Type type;
  long in_FS_OFFSET;
  QString local_48;
  QCborValue local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(QCborContainerPrivate **)(this + 8) != (QCborContainerPrivate *)0x0) {
    idx = -(long)*(int *)(this + 0x10);
    if (-1 < *(long *)this) {
      idx = *(long *)this;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      qt_convertToJson(__return_storage_ptr__,*(QCborContainerPrivate **)(this + 8),idx,FromRaw);
      return __return_storage_ptr__;
    }
    goto LAB_002ec839;
  }
  t = *(Type *)(this + 0x10);
  if (t < True) {
    if (t < Array) {
      if (t < ByteArray) {
        if (t == Invalid) goto LAB_002ec69a;
        if (t == Integer) {
          *(undefined1 **)&(__return_storage_ptr__->value).t = &DAT_aaaaaaaaaaaaaaaa;
          (__return_storage_ptr__->value).n = (qint64)&DAT_aaaaaaaaaaaaaaaa;
          (__return_storage_ptr__->value).container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa
          ;
          QJsonValue::QJsonValue(__return_storage_ptr__,Null);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
            operator=((QCborValue *)__return_storage_ptr__,(QCborValue *)this);
            return __return_storage_ptr__;
          }
          goto LAB_002ec839;
        }
      }
      else if ((t == ByteArray) || (t == String)) {
        if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_002ec839;
        type = String;
        goto LAB_002ec6db;
      }
      goto LAB_002ec736;
    }
    if (0xbf < t) {
      if (t == Tag) goto LAB_002ec67c;
      if (t == False) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          b = false;
          goto LAB_002ec72c;
        }
        goto LAB_002ec839;
      }
      goto LAB_002ec736;
    }
    if (t == Array) {
      QJsonArray::QJsonArray((QJsonArray *)&local_30);
      QJsonValue::QJsonValue(__return_storage_ptr__,(QJsonArray *)&local_30);
      QJsonArray::~QJsonArray((QJsonArray *)&local_30);
    }
    else {
      if (t != Map) goto LAB_002ec736;
      QJsonObject::QJsonObject((QJsonObject *)&local_30);
      QJsonValue::QJsonValue(__return_storage_ptr__,(QJsonObject *)&local_30);
      QJsonObject::~QJsonObject((QJsonObject *)&local_30);
    }
  }
  else {
    if (t < DateTime) {
      if ((uint)(t + ~True) < 2) {
LAB_002ec69a:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          type = Null;
          goto LAB_002ec6db;
        }
        goto LAB_002ec839;
      }
      if (t == True) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          b = true;
LAB_002ec72c:
          QJsonValue::QJsonValue(__return_storage_ptr__,b);
          return __return_storage_ptr__;
        }
        goto LAB_002ec839;
      }
      if (t == Double) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          fpToJson(*(double *)this);
          return __return_storage_ptr__;
        }
        goto LAB_002ec839;
      }
    }
    else if (((uint)(t + 0xffff0000) < 0x26) &&
            ((0x2900000001U >> ((ulong)(uint)(t + 0xffff0000) & 0x3f) & 1) != 0)) {
LAB_002ec67c:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        type = Undefined;
LAB_002ec6db:
        QJsonValue::QJsonValue(__return_storage_ptr__,type);
        return __return_storage_ptr__;
      }
      goto LAB_002ec839;
    }
LAB_002ec736:
    simpleTypeString(&local_48,t);
    QCborValue((QCborValue *)&local_30,&local_48);
    *(undefined1 **)&(__return_storage_ptr__->value).t = &DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->value).n = (qint64)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->value).container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QJsonValue::QJsonValue(__return_storage_ptr__,Null);
    operator=((QCborValue *)__return_storage_ptr__,&local_30);
    ~QCborValue((QCborValue *)&local_30);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
LAB_002ec839:
  __stack_chk_fail();
}

Assistant:

QJsonValue QCborValue::toJsonValue() const
{
    if (container)
        return qt_convertToJson(container, n < 0 ? -type() : n);

    // simple values
    switch (type()) {
    case False:
        return false;

    case Integer:
        return QJsonPrivate::Value::fromTrustedCbor(*this);

    case True:
        return true;

    case Null:
    case Undefined:
    case Invalid:
        return QJsonValue();

    case Double:
        return fpToJson(fp_helper());

    case SimpleType:
        break;

    case ByteArray:
    case String:
        // empty strings
        return QJsonValue::String;

    case Array:
        // empty array
        return QJsonArray();

    case Map:
        // empty map
        return QJsonObject();

    case Tag:
    case DateTime:
    case Url:
    case RegularExpression:
    case Uuid:
        // Reachable, but invalid in Json
        return QJsonValue::Undefined;
    }

    return QJsonPrivate::Value::fromTrustedCbor(simpleTypeString(type()));
}